

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

void Saig_ManFilterUsingInd(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *pSat_00;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar4;
  char *pcVar5;
  int local_60;
  int local_5c;
  int Counter;
  int k2;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Aig_Man_t *pFrames;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nProps_local;
  int nConfs_local;
  Vec_Vec_t *vCands_local;
  Aig_Man_t *p_local;
  
  p_00 = Saig_ManCreateIndMiter(p,vCands);
  iVar1 = Aig_ManCoNum(p_00);
  iVar2 = Vec_VecSizeSize(vCands);
  if (iVar1 == iVar2) {
    iVar1 = Aig_ManCoNum(p_00);
    p_01 = Cnf_DeriveSimple(p_00,iVar1);
    pSat_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
    if (fVerbose != 0) {
      printf("Filtered cands:  ");
    }
    local_60 = 0;
    for (k2 = 0; iVar1 = Vec_VecSize(vCands), k2 < iVar1; k2 = k2 + 1) {
      p_02 = Vec_VecEntry(vCands,k2);
      local_5c = 0;
      for (Counter = 0; iVar1 = Vec_PtrSize(p_02), Counter < iVar1; Counter = Counter + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_02,Counter);
        iVar1 = Saig_ManFilterUsingIndOne_new(p,p_00,pSat_00,p_01,nConfs,nProps,local_60);
        if (iVar1 != 0) {
          iVar1 = local_5c + 1;
          Vec_PtrWriteEntry(p_02,local_5c,pAVar4);
          local_5c = iVar1;
          if (fVerbose != 0) {
            iVar1 = Aig_IsComplement(pAVar4);
            pcVar5 = "";
            if (iVar1 != 0) {
              pcVar5 = "!";
            }
            pAVar4 = Aig_Regular(pAVar4);
            uVar3 = Aig_ObjId(pAVar4);
            printf("%d:%s%d  ",(ulong)(uint)k2,pcVar5,(ulong)uVar3);
          }
        }
        local_60 = local_60 + 1;
      }
      Vec_PtrShrink(p_02,local_5c);
    }
    if (fVerbose != 0) {
      printf("\n");
    }
    Cnf_DataFree(p_01);
    sat_solver_delete(pSat_00);
    if (fVerbose != 0) {
      Aig_ManPrintStats(p_00);
    }
    Aig_ManStop(p_00);
    return;
  }
  __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigConstr2.c"
                ,0x166,"void Saig_ManFilterUsingInd(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
}

Assistant:

void Saig_ManFilterUsingInd( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, k, k2, Counter;
/*
    Vec_VecForEachLevel( vCands, vNodes, i )
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
            printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
*/
    // create timeframes
//    pFrames = Saig_ManUnrollInd( p );
    pFrames = Saig_ManCreateIndMiter( p, vCands );
    assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands) );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // check candidates
    if ( fVerbose )
        printf( "Filtered cands:  " );
    Counter = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        k2 = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            if ( Saig_ManFilterUsingIndOne_new( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ ) )
//            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
                Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                    printf( "%d:%s%d  ", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            }
        }
        Vec_PtrShrink( vNodes, k2 );
    }
    if ( fVerbose )
        printf( "\n" );
    // clean up
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( fVerbose )
        Aig_ManPrintStats( pFrames );
    Aig_ManStop( pFrames );
}